

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::setStateLowerBound
          (OptimalControlProblem *this,VectorDynSize *minState)

{
  bool bVar1;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *__r;
  element_type *this_00;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *psVar2;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     ((in_RDI->
                      super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr + 3));
  if (bVar1) {
    __r = (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *)
          iDynTree::VectorDynSize::size();
    this_00 = std::
              __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2fc83e);
    psVar2 = (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *)
             DynamicalSystem::stateSpaceSize(this_00);
    if (__r == psVar2) {
      *(undefined1 *)
       &(in_RDI->
        super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr[0x11]._vptr_TimeVaryingObject = 1;
      std::
      make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,iDynTree::VectorDynSize_const&>
                ((VectorDynSize *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>>::
      operator=(in_RDI,__r);
      std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>::
      ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>
                   *)0x2fc8b4);
      bVar1 = true;
    }
    else {
      iDynTree::reportError
                ("OptimalControlProblem","setStateLowerBound",
                 "The dimension of minState does not coincide with the state dimension.");
      bVar1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("OptimalControlProblem","setStateLowerBound",
               "First a dynamical system has to be set.");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OptimalControlProblem::setStateLowerBound(const VectorDynSize &minState)
        {
            if (!(m_pimpl->dynamicalSystem)){
                reportError("OptimalControlProblem", "setStateLowerBound", "First a dynamical system has to be set.");
                return false;
            }

            if (minState.size() != m_pimpl->dynamicalSystem->stateSpaceSize()) {
                reportError("OptimalControlProblem", "setStateLowerBound", "The dimension of minState does not coincide with the state dimension.");
                return false;
            }
            m_pimpl->stateLowerBounded = true;
            m_pimpl->stateLowerBound = std::make_shared<TimeInvariantVector>(minState);

            return true;
        }